

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O3

void __thiscall soul::heart::Printer::PrinterStream::printOutputs(PrinterStream *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  OutputDeclaration *pOVar2;
  CodePrinter *pCVar3;
  PrinterStream *this_00;
  uint uVar4;
  size_t sVar5;
  optional<unsigned_int> *in_RCX;
  pointer ppVar6;
  string_view text;
  string_view text_00;
  string_view text_01;
  char s [2];
  allocator<char> local_c1;
  string local_c0;
  PrinterStream *local_a0;
  string local_98;
  string local_78;
  pointer local_58;
  string local_50;
  
  ppVar6 = (this->module->outputs).
           super__Vector_base<soul::pool_ref<soul::heart::OutputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::OutputDeclaration>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_58 = (this->module->outputs).
             super__Vector_base<soul::pool_ref<soul::heart::OutputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::OutputDeclaration>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar6 != local_58) {
    paVar1 = &local_c0.field_2;
    local_a0 = this;
    do {
      pOVar2 = ppVar6->object;
      pCVar3 = local_a0->out;
      text._M_str = "output  ";
      text._M_len = 8;
      choc::text::CodePrinter::writeBlock(pCVar3,text);
      nameWithArray_abi_cxx11_
                (&local_78,(PrinterStream *)&(pOVar2->super_IODeclaration).name,
                 (Identifier *)&(pOVar2->super_IODeclaration).arraySize,in_RCX);
      padded(&local_c0,&local_78,0x14);
      text_00._M_str = local_c0._M_dataplus._M_p;
      text_00._M_len = local_c0._M_string_length;
      choc::text::CodePrinter::writeBlock(pCVar3,text_00);
      uVar4 = (pOVar2->super_IODeclaration).endpointType - stream;
      if (2 < uVar4) {
        throwInternalCompilerError("t != nullptr","getEndpointTypeName",0x44);
      }
      in_RCX = (optional<unsigned_int> *)&DAT_002caaa0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,*(char **)(&DAT_002caaa0 + (ulong)uVar4 * 8),&local_c1);
      padded(&local_98,&local_50,8);
      text_01._M_str = local_98._M_dataplus._M_p;
      text_01._M_len = local_98._M_string_length;
      choc::text::CodePrinter::writeBlock(pCVar3,text_01);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != paVar1) {
        operator_delete(local_c0._M_dataplus._M_p,
                        CONCAT62(local_c0.field_2._M_allocated_capacity._2_6_,
                                 local_c0.field_2._M_allocated_capacity._0_2_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT62(local_78._M_dataplus._M_p._2_6_,local_78._M_dataplus._M_p._0_2_) !=
          &local_78.field_2) {
        operator_delete((undefined1 *)
                        CONCAT62(local_78._M_dataplus._M_p._2_6_,local_78._M_dataplus._M_p._0_2_),
                        local_78.field_2._M_allocated_capacity + 1);
      }
      this_00 = local_a0;
      printDescription(local_a0,&(pOVar2->super_IODeclaration).dataTypes);
      printDescription(this_00,&(pOVar2->super_IODeclaration).annotation);
      pCVar3 = this_00->out;
      local_78._M_dataplus._M_p._0_2_ = 0x3b;
      local_c0._M_dataplus._M_p = (pointer)paVar1;
      sVar5 = strlen((char *)&local_78);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c0,&local_78,(long)&local_78._M_dataplus._M_p + sVar5);
      choc::text::CodePrinter::append(pCVar3,&local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != paVar1) {
        operator_delete(local_c0._M_dataplus._M_p,
                        CONCAT62(local_c0.field_2._M_allocated_capacity._2_6_,
                                 local_c0.field_2._M_allocated_capacity._0_2_) + 1);
      }
      local_c0.field_2._M_allocated_capacity._0_2_ = 10;
      local_c0._M_string_length = 1;
      local_c0._M_dataplus._M_p = (pointer)paVar1;
      choc::text::CodePrinter::append(pCVar3,&local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != paVar1) {
        operator_delete(local_c0._M_dataplus._M_p,
                        CONCAT62(local_c0.field_2._M_allocated_capacity._2_6_,
                                 local_c0.field_2._M_allocated_capacity._0_2_) + 1);
      }
      ppVar6 = ppVar6 + 1;
    } while (ppVar6 != local_58);
  }
  return;
}

Assistant:

void printOutputs()
        {
            for (auto io : module.outputs)
            {
                out << "output  "
                    << padded (nameWithArray (io->name, io->arraySize), 20)
                    << padded (getEndpointTypeName (io->endpointType), 8);

                printDescription (io->dataTypes);
                printDescription (io->annotation);
                out << ';' << newLine;
            }
        }